

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Expression * __thiscall
wasm::TranslateToFuzzReader::makeGlobalGet(TranslateToFuzzReader *this,Type type)

{
  char *pcVar1;
  size_t sVar2;
  Type TVar3;
  iterator iVar4;
  value_type *pvVar5;
  Expression *pEVar6;
  long lVar7;
  Type local_30;
  Type type_local;
  
  lVar7 = 0x148;
  if ((this->funcContext == (FunctionCreationContext *)0x0) &&
     (lVar7 = 0x1b8, ((this->wasm->features).features & 0x400) == 0)) {
    lVar7 = 0x1f0;
  }
  local_30.id = type.id;
  iVar4 = std::
          _Hashtable<wasm::Type,_std::pair<const_wasm::Type,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<wasm::Type,_std::pair<const_wasm::Type,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)((long)&this->wasm + lVar7),&local_30);
  if ((iVar4.
       super__Node_iterator_base<std::pair<const_wasm::Type,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_true>
       ._M_cur == (__node_type *)0x0) ||
     (*(long *)((long)iVar4.
                      super__Node_iterator_base<std::pair<const_wasm::Type,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_true>
                      ._M_cur + 0x10) ==
      *(long *)((long)iVar4.
                      super__Node_iterator_base<std::pair<const_wasm::Type,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_true>
                      ._M_cur + 0x18))) {
    pEVar6 = makeConst(this,local_30);
  }
  else {
    pvVar5 = Random::pick<std::vector<wasm::Name,std::allocator<wasm::Name>>>
                       (&this->random,
                        (vector<wasm::Name,_std::allocator<wasm::Name>_> *)
                        ((long)iVar4.
                               super__Node_iterator_base<std::pair<const_wasm::Type,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_true>
                               ._M_cur + 0x10));
    TVar3.id = local_30.id;
    pcVar1 = (pvVar5->super_IString).str._M_str;
    if (pcVar1 == (this->HANG_LIMIT_GLOBAL).super_IString.str._M_str) {
      __assert_fail("name != HANG_LIMIT_GLOBAL",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0xae0,"Expression *wasm::TranslateToFuzzReader::makeGlobalGet(Type)");
    }
    sVar2 = (pvVar5->super_IString).str._M_len;
    pEVar6 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x20,8);
    pEVar6->_id = GlobalGetId;
    (pEVar6->type).id = 0;
    *(undefined8 *)(pEVar6 + 1) = 0;
    *(size_t *)(pEVar6 + 1) = sVar2;
    pEVar6[1].type.id = (uintptr_t)pcVar1;
    (pEVar6->type).id = TVar3.id;
  }
  return pEVar6;
}

Assistant:

Expression* TranslateToFuzzReader::makeGlobalGet(Type type) {
  // In a non-function context, like in another global, we can only get from an
  // immutable global. Whether GC is enabled also matters, as it allows getting
  // from a non-import.
  auto& relevantGlobals =
    funcContext ? globalsByType
                : (wasm.features.hasGC() ? immutableGlobalsByType
                                         : importedImmutableGlobalsByType);
  auto it = relevantGlobals.find(type);
  // If we have no such relevant globals give up and emit a constant instead.
  if (it == relevantGlobals.end() || it->second.empty()) {
    return makeConst(type);
  }

  auto name = pick(it->second);
  // We don't want random fuzz code to use the hang limit global.
  assert(name != HANG_LIMIT_GLOBAL);
  return builder.makeGlobalGet(name, type);
}